

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Deserializer.hpp
# Opt level: O2

void mserialize::detail::
     BuiltinDeserializer<boost::optional<std::vector<std::tuple<int>,_std::allocator<std::tuple<int>_>_>_>,_void>
     ::deserialize<InputStream>
               (optional<std::vector<std::tuple<int>,_std::allocator<std::tuple<int>_>_>_> *opt,
               InputStream *istream)

{
  uint8_t discriminator;
  uchar local_39;
  optional_base<std::vector<std::tuple<int>,_std::allocator<std::tuple<int>_>_>_> local_38;
  
  TrivialDeserializer<unsigned_char>::deserialize<InputStream>(&local_39,istream);
  if (local_39 == '\0') {
    local_38.m_initialized = false;
    boost::optional_detail::
    optional_base<std::vector<std::tuple<int>,_std::allocator<std::tuple<int>_>_>_>::operator=
              (&opt->super_type,&local_38);
    boost::optional_detail::
    optional_base<std::vector<std::tuple<int>,_std::allocator<std::tuple<int>_>_>_>::~optional_base
              (&local_38);
  }
  else {
    BuiltinDeserializer<boost::optional<std::vector<std::tuple<int>,std::allocator<std::tuple<int>>>>,void>
    ::make_nonempty<boost::optional<std::vector<std::tuple<int>,std::allocator<std::tuple<int>>>>>
              (opt);
    BuiltinDeserializer<std::vector<std::tuple<int>,_std::allocator<std::tuple<int>_>_>,_void>::
    deserialize<InputStream>
              ((vector<std::tuple<int>,_std::allocator<std::tuple<int>_>_> *)
               &(opt->super_type).m_storage,istream);
  }
  return;
}

Assistant:

static void deserialize(Optional& opt, InputStream& istream)
  {
    std::uint8_t discriminator;
    mserialize::deserialize(discriminator, istream);
    if (discriminator)
    {
      assert(discriminator == 1 && "Discriminator of non-empty optional must be 1");
      make_nonempty(opt);
      mserialize::deserialize(*opt, istream);
    }
    else
    {
      opt = {};
    }
  }